

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)8>_> *
vkt::memory::anon_unknown_0::createBuffer
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkDeviceSize size,VkBufferUsageFlags usage,VkSharingMode sharingMode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies)

{
  size_type sVar1;
  undefined1 local_68 [8];
  VkBufferCreateInfo createInfo;
  VkSharingMode sharingMode_local;
  VkBufferUsageFlags usage_local;
  VkDeviceSize size_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  
  local_68._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 0;
  createInfo._16_8_ = size;
  createInfo.size._0_4_ = usage;
  createInfo.size._4_4_ = sharingMode;
  createInfo.pQueueFamilyIndices._0_4_ = sharingMode;
  createInfo.pQueueFamilyIndices._4_4_ = usage;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(queueFamilies);
  createInfo.usage = (VkBufferUsageFlags)sVar1;
  createInfo._40_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](queueFamilies,0);
  ::vk::createBuffer(__return_storage_ptr__,vkd,device,(VkBufferCreateInfo *)local_68,
                     (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkBuffer> createBuffer (const vk::DeviceInterface&	vkd,
									 vk::VkDevice				device,
									 vk::VkDeviceSize			size,
									 vk::VkBufferUsageFlags		usage,
									 vk::VkSharingMode			sharingMode,
									 const vector<deUint32>&	queueFamilies)
{
	const vk::VkBufferCreateInfo	createInfo =
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
		DE_NULL,

		0,	// flags
		size,
		usage,
		sharingMode,
		(deUint32)queueFamilies.size(),
		&queueFamilies[0]
	};

	return vk::createBuffer(vkd, device, &createInfo);
}